

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O0

void __thiscall FlowInfo::truncateIndirectJump(FlowInfo *this,PcodeOp *op,int4 failuremode)

{
  Funcdata *this_00;
  FuncCallSpecs *this_01;
  Address *pAVar1;
  allocator local_49;
  string local_48 [32];
  PcodeOp *local_28;
  PcodeOp *truncop;
  bool tryoverride;
  PcodeOp *pPStack_18;
  int4 failuremode_local;
  PcodeOp *op_local;
  FlowInfo *this_local;
  
  truncop._4_4_ = failuremode;
  pPStack_18 = op;
  op_local = (PcodeOp *)this;
  Funcdata::opSetOpcode(this->data,op,CPUI_CALLIND);
  truncop._3_1_ = truncop._4_4_ == 2;
  setupCallindSpecs(this,pPStack_18,(bool)truncop._3_1_,(FuncCallSpecs *)0x0);
  this_01 = Funcdata::getCallSpecs(this->data,pPStack_18);
  FuncCallSpecs::setBadJumpTable(this_01,true);
  pAVar1 = PcodeOp::getAddr(pPStack_18);
  local_28 = artificialHalt(this,pAVar1,0);
  Funcdata::opDeadInsertAfter(this->data,local_28,pPStack_18);
  this_00 = this->data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Treating indirect jump as call",&local_49);
  pAVar1 = PcodeOp::getAddr(pPStack_18);
  Funcdata::warning(this_00,(string *)local_48,pAVar1);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void FlowInfo::truncateIndirectJump(PcodeOp *op,int4 failuremode)

{
  data.opSetOpcode(op,CPUI_CALLIND); // Turn jump into call
  bool tryoverride = (failuremode == 2);
  setupCallindSpecs(op,tryoverride,(FuncCallSpecs *)0);
  data.getCallSpecs(op)->setBadJumpTable(true);

  // Create an artificial return
  PcodeOp *truncop = artificialHalt(op->getAddr(),0);
  data.opDeadInsertAfter(truncop,op);

  data.warning("Treating indirect jump as call",op->getAddr());
}